

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O2

int amqp_messenger_start(AMQP_MESSENGER_HANDLE messenger_handle,SESSION_HANDLE session_handle)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  AMQP_MESSENGER_INSTANCE_conflict *instance;
  
  if (messenger_handle == (AMQP_MESSENGER_HANDLE)0x0 || session_handle == (SESSION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x4ae;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x4ae;
    }
    pcVar4 = "Invalid argument (session_handle is NULL)";
    iVar2 = 0x4ad;
  }
  else {
    if (messenger_handle->state == AMQP_MESSENGER_STATE_STOPPED) {
      messenger_handle->session_handle = session_handle;
      update_messenger_state(messenger_handle,AMQP_MESSENGER_STATE_STARTING);
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x4b6;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x4b6;
    }
    pcVar4 = 
    "amqp_messenger_start failed (current state is %d; expected AMQP_MESSENGER_STATE_STOPPED)";
    iVar2 = 0x4b7;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
            ,"amqp_messenger_start",iVar2,1,pcVar4);
  return iVar3;
}

Assistant:

int amqp_messenger_start(AMQP_MESSENGER_HANDLE messenger_handle, SESSION_HANDLE session_handle)
{
    int result;

    if (messenger_handle == NULL || session_handle == NULL)
    {
        LogError("Invalid argument (session_handle is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* instance = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        if (instance->state != AMQP_MESSENGER_STATE_STOPPED)
        {
            result = MU_FAILURE;
            LogError("amqp_messenger_start failed (current state is %d; expected AMQP_MESSENGER_STATE_STOPPED)", instance->state);
        }
        else
        {
            instance->session_handle = session_handle;

            update_messenger_state(instance, AMQP_MESSENGER_STATE_STARTING);

            result = RESULT_OK;
        }
    }

    return result;
}